

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

int Aig_ManRemapRepr(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  
  pVVar7 = p->vObjs;
  if (pVVar7->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar8 = 0;
    iVar6 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)pVVar7->pArray[lVar8];
      if ((pAVar3 != (Aig_Obj_t *)0x0) &&
         (uVar9 = (uint)*(undefined8 *)&pAVar3->field_0x18, 0xfffffffd < (uVar9 & 7) - 7)) {
        ppAVar4 = p->pReprs;
        if (ppAVar4 == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pReprs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                        ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (((ulong)pAVar3 & 1) != 0) {
LAB_00612bf5:
          __assert_fail("!Aig_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                        ,0x86,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        iVar1 = pAVar3->Id;
        if (p->nReprsAlloc <= iVar1) {
LAB_00612c14:
          __assert_fail("pNode->Id < p->nReprsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                        ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        pAVar5 = ppAVar4[iVar1];
        if (ppAVar4[iVar1] != (Aig_Obj_t *)0x0) {
          do {
            pAVar10 = pAVar5;
            if (((ulong)pAVar10 & 1) != 0) goto LAB_00612bf5;
            iVar2 = pAVar10->Id;
            if (p->nReprsAlloc <= iVar2) goto LAB_00612c14;
            pAVar5 = ppAVar4[iVar2];
          } while (ppAVar4[iVar2] != (Aig_Obj_t *)0x0);
          if (iVar1 <= iVar2) {
            __assert_fail("pRepr->Id < pObj->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRepr.c"
                          ,0x168,"int Aig_ManRemapRepr(Aig_Man_t *)");
          }
          if (pAVar3 != pAVar10) {
            ppAVar4[iVar1] = pAVar10;
            uVar9 = (uint)*(undefined8 *)&pAVar3->field_0x18;
            pVVar7 = p->vObjs;
          }
          iVar6 = (iVar6 + 1) - (uint)((uVar9 & 0xffffffc0) == 0);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
  }
  return iVar6;
}

Assistant:

int Aig_ManRemapRepr( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nFanouts = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindReprTransitive( p, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        Aig_ObjSetRepr_( p, pObj, pRepr );
        nFanouts += (pObj->nRefs > 0);
    }
    return nFanouts;
}